

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::FindPackageStackRAII::FindPackageStackRAII
          (FindPackageStackRAII *this,cmMakefile *mf,string *name)

{
  cmMakefile *pcVar1;
  cmFindPackageCall local_58;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack> local_30;
  string *local_20;
  string *name_local;
  cmMakefile *mf_local;
  FindPackageStackRAII *this_local;
  
  this->Makefile = mf;
  pcVar1 = this->Makefile;
  local_20 = name;
  name_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)name);
  local_58.Index = this->Makefile->FindPackageStackNextIndex;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Push
            (&local_30,(cmFindPackageCall *)&pcVar1->FindPackageStack);
  cmFindPackageStack::operator=(&this->Makefile->FindPackageStack,(cmFindPackageStack *)&local_30);
  cmFindPackageStack::~cmFindPackageStack((cmFindPackageStack *)&local_30);
  cmFindPackageCall::~cmFindPackageCall(&local_58);
  this->Makefile->FindPackageStackNextIndex = this->Makefile->FindPackageStackNextIndex + 1;
  return;
}

Assistant:

cmMakefile::FindPackageStackRAII::FindPackageStackRAII(cmMakefile* mf,
                                                       std::string const& name)
  : Makefile(mf)
{
  this->Makefile->FindPackageStack =
    this->Makefile->FindPackageStack.Push(cmFindPackageCall{
      name,
      this->Makefile->FindPackageStackNextIndex,
    });
  this->Makefile->FindPackageStackNextIndex++;
}